

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elasticConstantsCmd.cpp
# Opt level: O1

char * gengetopt_strdup(char *s)

{
  size_t sVar1;
  char *pcVar2;
  
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    pcVar2 = (char *)malloc(sVar1 + 1);
    if (pcVar2 != (char *)0x0) {
      pcVar2 = strcpy(pcVar2,s);
      return pcVar2;
    }
  }
  return (char *)0x0;
}

Assistant:

char *
gengetopt_strdup (const char *s)
{
  char *result = 0;
  if (!s)
    return result;

  result = (char*)malloc(strlen(s) + 1);
  if (result == (char*)0)
    return (char*)0;
  strcpy(result, s);
  return result;
}